

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::AddSpaceBetweenCapitalizedWords
                   (string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 local_38;
  size_t i;
  string *s_local;
  string *n;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
    for (local_38 = 1; uVar2 = std::__cxx11::string::size(), local_38 < uVar2;
        local_38 = local_38 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      iVar1 = isupper((int)*pcVar3);
      if (iVar1 != 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        iVar1 = isspace((int)*pcVar3);
        if (iVar1 == 0) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
          iVar1 = isupper((int)*pcVar3);
          if (iVar1 == 0) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
          }
        }
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::AddSpaceBetweenCapitalizedWords(
  const std::string& s)
{
  std::string n;
  if (!s.empty())
    {
    n.reserve(s.size());
    n += s[0];
    for (size_t i = 1; i < s.size(); i++)
      {
      if (isupper(s[i]) && !isspace(s[i - 1]) && !isupper(s[i - 1]))
        {
        n += ' ';
        }
      n += s[i];
      }
    }
  return n;
}